

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

Totals * __thiscall
Catch::Totals::delta(Totals *__return_storage_ptr__,Totals *this,Totals *prevTotals)

{
  size_t *psVar1;
  
  operator-(this,prevTotals);
  psVar1 = &(__return_storage_ptr__->testCases).passed +
           ((__return_storage_ptr__->assertions).failed != 0);
  *psVar1 = *psVar1 + 1;
  return __return_storage_ptr__;
}

Assistant:

Totals delta( const Totals& prevTotals ) const {
            Totals diff = *this - prevTotals;
            if( diff.assertions.failed > 0 )
                ++diff.testCases.failed;
            else
                ++diff.testCases.passed;
            return diff;
        }